

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.cpp
# Opt level: O3

void __thiscall OpenMD::TorsionStamp::~TorsionStamp(TorsionStamp *this)

{
  ~TorsionStamp(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TorsionStamp::~TorsionStamp() {}